

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fire.hpp
# Opt level: O0

longdouble * __thiscall
fire::optional<long_double>::value(longdouble *__return_storage_ptr__,optional<long_double> *this)

{
  byte bVar1;
  allocator<char> local_31;
  string local_30;
  longdouble *local_10;
  optional<long_double> *this_local;
  
  bVar1 = *(byte *)(__return_storage_ptr__ + 1);
  local_10 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"accessing unassigned optional",&local_31);
  _instant_assert((bool)(bVar1 & 1),&local_30,true);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return __return_storage_ptr__;
}

Assistant:

T value() const { _instant_assert(_exists, "accessing unassigned optional"); return _value; }